

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateViewportsNewFrame(void)

{
  ImGuiViewportP **ppIVar1;
  ImVec2 local_38;
  ImGuiViewportP *local_30;
  ImGuiViewportP *viewport;
  ImVec2 IStack_20;
  int n;
  ImGuiViewportP *local_18;
  ImGuiViewportP *main_viewport;
  ImGuiContext *g;
  
  main_viewport = (ImGuiViewportP *)GImGui;
  if ((GImGui->Viewports).Size == 1) {
    ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
    local_18 = *ppIVar1;
    (local_18->super_ImGuiViewport).Flags = 5;
    ImVec2::ImVec2(&stack0xffffffffffffffe0,0.0,0.0);
    (local_18->super_ImGuiViewport).Pos = IStack_20;
    (local_18->super_ImGuiViewport).Size = *(ImVec2 *)&(main_viewport->super_ImGuiViewport).Size.y;
    for (viewport._4_4_ = 0; viewport._4_4_ < main_viewport[0x59].DrawListsLastFrame[0];
        viewport._4_4_ = viewport._4_4_ + 1) {
      ppIVar1 = ImVector<ImGuiViewportP_*>::operator[]
                          ((ImVector<ImGuiViewportP_*> *)main_viewport[0x59].DrawListsLastFrame,
                           viewport._4_4_);
      local_30 = *ppIVar1;
      local_30->WorkOffsetMin = local_30->BuildWorkOffsetMin;
      local_30->WorkOffsetMax = local_30->BuildWorkOffsetMax;
      ImVec2::ImVec2(&local_38,0.0,0.0);
      local_30->BuildWorkOffsetMax = local_38;
      local_30->BuildWorkOffsetMin = local_30->BuildWorkOffsetMax;
      ImGuiViewportP::UpdateWorkRect(local_30);
    }
    return;
  }
  __assert_fail("g.Viewports.Size == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x2e14,"void ImGui::UpdateViewportsNewFrame()");
}

Assistant:

static void ImGui::UpdateViewportsNewFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Viewports.Size == 1);

    // Update main viewport with current platform position.
    // FIXME-VIEWPORT: Size is driven by backend/user code for backward-compatibility but we should aim to make this more consistent.
    ImGuiViewportP* main_viewport = g.Viewports[0];
    main_viewport->Flags = ImGuiViewportFlags_IsPlatformWindow | ImGuiViewportFlags_OwnedByApp;
    main_viewport->Pos = ImVec2(0.0f, 0.0f);
    main_viewport->Size = g.IO.DisplaySize;

    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];

        // Lock down space taken by menu bars and status bars, reset the offset for fucntions like BeginMainMenuBar() to alter them again.
        viewport->WorkOffsetMin = viewport->BuildWorkOffsetMin;
        viewport->WorkOffsetMax = viewport->BuildWorkOffsetMax;
        viewport->BuildWorkOffsetMin = viewport->BuildWorkOffsetMax = ImVec2(0.0f, 0.0f);
        viewport->UpdateWorkRect();
    }
}